

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IndirectDispatchCase::iterate(IndirectDispatchCase *this)

{
  code *pcVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  deBool dVar5;
  deUint32 dVar6;
  RenderContext *renderCtx_00;
  undefined4 extraout_var;
  TestLog *pTVar7;
  TestError *this_00;
  MessageBuilder *pMVar8;
  size_type sVar9;
  reference pvVar10;
  pointer pDVar11;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>_>
  local_5c8;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>_>
  local_5c0;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>_>
  local_5b8;
  const_iterator cmdIter;
  deIntptr curOffset;
  undefined1 local_5a0 [4];
  int resultBlockAlignedSize;
  unsigned_long local_420;
  size_t cmdNdx;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  ScopedLogSection local_388;
  ScopedLogSection section;
  undefined1 local_200 [8];
  Buffer resultBuffer;
  Buffer cmdBuffer;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram program;
  Functions *gl;
  RenderContext *renderCtx;
  IndirectDispatchCase *this_local;
  
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*renderCtx_00->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  genVerifySources(&local_1c0,&this->m_workGroupSize);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,renderCtx_00,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&resultBuffer.super_ObjectWrapper.m_object,
             renderCtx_00);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_200,renderCtx_00);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)local_f0);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 &&
         (bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0), bVar3))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&section,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&section,
                          (char (*) [36])"GL_DISPATCH_INDIRECT_BUFFER size = ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_bufferSize);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"Commands",&local_3a9)
      ;
      cmdNdx = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
               ::size(&this->m_commands);
      de::toString<unsigned_long>(&local_410,&cmdNdx);
      std::operator+(&local_3f0,"Indirect Dispatch Commands (",&local_410);
      std::operator+(&local_3d0,&local_3f0," in total)");
      tcu::ScopedLogSection::ScopedLogSection(&local_388,pTVar7,&local_3a8,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator(&local_3a9);
      for (local_420 = 0; uVar2 = local_420,
          sVar9 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                  ::size(&this->m_commands), uVar2 < sVar9; local_420 = local_420 + 1) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_5a0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_5a0,&local_420);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a0a8b4);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])0x2c387cd);
        pvVar10 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                  ::operator[](&this->m_commands,local_420);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->offset);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [19])", numWorkGroups = ");
        pvVar10 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                  ::operator[](&this->m_commands,local_420);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->numWorkGroups);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5a0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_388);
      dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_200);
      createResultBuffer(this,dVar6);
      dVar6 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&resultBuffer.super_ObjectWrapper.m_object);
      createCommandBuffer(this,dVar6);
      pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
      dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
      (*pcVar1)(dVar6);
      pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
      dVar6 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&resultBuffer.super_ObjectWrapper.m_object);
      (*pcVar1)(0x90ee,dVar6);
      dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar6,"State setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0x16f);
      iVar4 = getResultBlockAlignedSize((Functions *)program.m_program.m_info.linkTimeUs);
      cmdIter._M_current = (DispatchCommand *)0x0;
      local_5c0._M_current =
           (DispatchCommand *)
           std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
           ::begin(&this->m_commands);
      __gnu_cxx::
      __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>>>
      ::
      __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand*>
                ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>>>
                  *)&local_5b8,&local_5c0);
      while( true ) {
        local_5c8._M_current =
             (DispatchCommand *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
             ::end(&this->m_commands);
        bVar3 = __gnu_cxx::operator!=(&local_5b8,&local_5c8);
        if (!bVar3) break;
        pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x50);
        dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_200);
        (*pcVar1)(0x90d2,0,dVar6,cmdIter._M_current,(long)iVar4);
        pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x530);
        pDVar11 = __gnu_cxx::
                  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>_>
                  ::operator->(&local_5b8);
        (*pcVar1)(pDVar11->offset);
        cmdIter._M_current =
             (DispatchCommand *)
             ((long)((cmdIter._M_current)->numWorkGroups).m_data + (long)iVar4 + -8);
        __gnu_cxx::
        __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>_>
        ::operator++(&local_5b8);
      }
      dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar6,"glDispatchComputeIndirect() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0x17e);
      dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_200);
      bVar3 = verifyResultBuffer(this,dVar6);
      if (bVar3) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid values in result buffer");
      }
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)local_200);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)
                 &resultBuffer.super_ObjectWrapper.m_object);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
             ,0x15e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IndirectDispatchCase::IterateResult IndirectDispatchCase::iterate (void)
{
	const glu::RenderContext&		renderCtx			= m_context.getRenderContext();
	const glw::Functions&			gl					= renderCtx.getFunctions();

	const glu::ShaderProgram		program				(renderCtx, genVerifySources(m_workGroupSize));

	glu::Buffer						cmdBuffer			(renderCtx);
	glu::Buffer						resultBuffer		(renderCtx);

	m_testCtx.getLog() << program;
	TCU_CHECK_MSG(program.isOk(), "Compile failed");

	m_testCtx.getLog() << TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(m_testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_commands.size()) + " in total)");

		for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
			m_testCtx.getLog() << TestLog::Message << cmdNdx << ": " << "offset = " << m_commands[cmdNdx].offset
												   << ", numWorkGroups = " << m_commands[cmdNdx].numWorkGroups
							   << TestLog::EndMessage;
	}

	createResultBuffer(*resultBuffer);
	createCommandBuffer(*cmdBuffer);

	gl.useProgram(program.getProgram());
	gl.bindBuffer(GL_DISPATCH_INDIRECT_BUFFER, *cmdBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "State setup failed");

	{
		const int	resultBlockAlignedSize		= getResultBlockAlignedSize(gl);
		deIntptr	curOffset					= 0;

		for (vector<DispatchCommand>::const_iterator cmdIter = m_commands.begin(); cmdIter != m_commands.end(); ++cmdIter)
		{
			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, *resultBuffer, (glw::GLintptr)curOffset, resultBlockAlignedSize);
			gl.dispatchComputeIndirect((glw::GLintptr)cmdIter->offset);

			curOffset += resultBlockAlignedSize;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchComputeIndirect() failed");

	if (verifyResultBuffer(*resultBuffer))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");

	return STOP;
}